

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  string *element_name;
  Message *descriptor;
  long lVar1;
  int i;
  long lVar2;
  long lVar3;
  SubstituteArg *in_stack_fffffffffffffda8;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  string local_80;
  SubstituteArg local_60;
  
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(message + 0x68); lVar2 = lVar2 + 1) {
    ValidateFieldOptions
              (this,(FieldDescriptor *)(*(long *)(message + 0x28) + lVar1),
               (FieldDescriptorProto *)
               ((proto->field_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    lVar1 = lVar1 + 0x98;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(message + 0x70); lVar2 = lVar2 + 1) {
    ValidateMessageOptions
              (this,(Descriptor *)(*(long *)(message + 0x38) + lVar1),
               (DescriptorProto *)
               ((proto->nested_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    lVar1 = lVar1 + 0x90;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(message + 0x74); lVar2 = lVar2 + 1) {
    ValidateEnumOptions(this,(EnumDescriptor *)(*(long *)(message + 0x40) + lVar1),
                        (EnumDescriptorProto *)
                        ((proto->enum_type_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    lVar1 = lVar1 + 0x50;
  }
  lVar1 = 0;
  for (lVar2 = 0; lVar2 < *(int *)(message + 0x7c); lVar2 = lVar2 + 1) {
    ValidateFieldOptions
              (this,(FieldDescriptor *)(*(long *)(message + 0x50) + lVar1),
               (FieldDescriptorProto *)
               ((proto->extension_).super_RepeatedPtrFieldBase.rep_)->elements[lVar2]);
    lVar1 = lVar1 + 0x98;
  }
  lVar1 = 0x1fffffff;
  if (*(char *)(*(long *)(message + 0x20) + 0x48) != '\0') {
    lVar1 = 0x7fffffff;
  }
  lVar2 = 4;
  for (lVar3 = 0; lVar3 < *(int *)(message + 0x78); lVar3 = lVar3 + 1) {
    if (lVar1 + 1 < (long)*(int *)(*(long *)(message + 0x48) + lVar2)) {
      element_name = *(string **)(message + 8);
      descriptor = (Message *)
                   ((proto->extension_range_).super_RepeatedPtrFieldBase.rep_)->elements[lVar3];
      strings::internal::SubstituteArg::SubstituteArg(&local_60,lVar1);
      local_b0.text_ = (char *)0x0;
      local_b0.size_ = -1;
      local_e0.text_ = (char *)0x0;
      local_e0.size_ = -1;
      local_110.text_ = (char *)0x0;
      local_110.size_ = -1;
      local_140.text_ = (char *)0x0;
      local_140.size_ = -1;
      local_170.text_ = (char *)0x0;
      local_170.size_ = -1;
      local_1a0.text_ = (char *)0x0;
      local_1a0.size_ = -1;
      local_1d0.text_ = (char *)0x0;
      local_1d0.size_ = -1;
      local_200.text_ = (char *)0x0;
      local_200.size_ = -1;
      local_230.text_ = (char *)0x0;
      local_230.size_ = -1;
      strings::Substitute_abi_cxx11_
                (&local_80,(strings *)"Extension numbers cannot be greater than $0.",
                 (char *)&local_60,&local_b0,&local_e0,&local_110,&local_140,&local_170,&local_1a0,
                 &local_1d0,&local_200,&local_230,in_stack_fffffffffffffda8);
      AddError(this,element_name,descriptor,NUMBER,&local_80);
      std::__cxx11::string::~string((string *)&local_80);
    }
    lVar2 = lVar2 + 0x10;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64 max_extension_range =
      static_cast<int64>(message->options().message_set_wire_format()
                             ? kint32max
                             : FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(
          message->full_name(), proto.extension_range(i),
          DescriptorPool::ErrorCollector::NUMBER,
          strings::Substitute("Extension numbers cannot be greater than $0.",
                              max_extension_range));
    }
  }
}